

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cpp
# Opt level: O3

int __thiscall Directory::close(Directory *this,int __fd)

{
  int in_EAX;
  
  if ((DIR *)this->dp != (DIR *)0x0) {
    in_EAX = closedir((DIR *)this->dp);
    this->dp = (void *)0x0;
  }
  return in_EAX;
}

Assistant:

void Directory::close()
{
#ifdef _WIN32
  if(findFile != INVALID_HANDLE_VALUE)
  {
    FindClose((HANDLE)findFile);
    findFile = INVALID_HANDLE_VALUE;
  }
#else
  if(dp)
  {
    closedir((DIR*)dp);
    dp = 0;
  }
#endif
}